

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackNSISGenerator::CreateSelectionDependenciesDescription_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackNSISGenerator *this,cmCPackComponent *component,
          set<cmCPackComponent_*,_std::less<cmCPackComponent_*>,_std::allocator<cmCPackComponent_*>_>
          *visited)

{
  bool bVar1;
  size_type sVar2;
  _Rb_tree_header *this_00;
  reference ppcVar3;
  ostream *poVar4;
  char *pcVar5;
  string local_200;
  cmCPackComponent *local_1d0;
  cmCPackComponent *depend;
  iterator __end1;
  iterator __begin1;
  vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *__range1;
  ostringstream out;
  set<cmCPackComponent_*,_std::less<cmCPackComponent_*>,_std::allocator<cmCPackComponent_*>_>
  *visited_local;
  cmCPackComponent *component_local;
  cmCPackNSISGenerator *this_local;
  
  visited_local =
       (set<cmCPackComponent_*,_std::less<cmCPackComponent_*>,_std::allocator<cmCPackComponent_*>_>
        *)component;
  component_local = (cmCPackComponent *)this;
  this_local = (cmCPackNSISGenerator *)__return_storage_ptr__;
  sVar2 = std::
          set<cmCPackComponent_*,_std::less<cmCPackComponent_*>,_std::allocator<cmCPackComponent_*>_>
          ::count(visited,(key_type *)&visited_local);
  if (sVar2 == 0) {
    std::set<cmCPackComponent_*,_std::less<cmCPackComponent_*>,_std::allocator<cmCPackComponent_*>_>
    ::insert(visited,(value_type *)&visited_local);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1);
    this_00 = &visited_local[4]._M_t._M_impl.super__Rb_tree_header;
    __end1 = std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::begin
                       ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)this_00);
    depend = (cmCPackComponent *)
             std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::end
                       ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                                  *)&depend);
      if (!bVar1) break;
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                ::operator*(&__end1);
      local_1d0 = *ppcVar3;
      poVar4 = std::operator<<((ostream *)&__range1,"  SectionGetFlags ${");
      poVar4 = std::operator<<(poVar4,(string *)local_1d0);
      std::operator<<(poVar4,"} $0\n");
      std::operator<<((ostream *)&__range1,"  IntOp $0 $0 | ${SF_SELECTED}\n");
      poVar4 = std::operator<<((ostream *)&__range1,"  SectionSetFlags ${");
      poVar4 = std::operator<<(poVar4,(string *)local_1d0);
      std::operator<<(poVar4,"} $0\n");
      poVar4 = std::operator<<((ostream *)&__range1,"  IntOp $");
      poVar4 = std::operator<<(poVar4,(string *)local_1d0);
      std::operator<<(poVar4,"_selected 0 + ${SF_SELECTED}\n");
      CreateSelectionDependenciesDescription_abi_cxx11_(&local_200,this,local_1d0,visited);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)&__range1,pcVar5);
      std::__cxx11::string::~string((string *)&local_200);
      __gnu_cxx::
      __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackNSISGenerator::CreateSelectionDependenciesDescription(
  cmCPackComponent* component, std::set<cmCPackComponent*>& visited)
{
  // Don't visit a component twice
  if (visited.count(component)) {
    return std::string();
  }
  visited.insert(component);

  std::ostringstream out;
  for (cmCPackComponent* depend : component->Dependencies) {
    // Write NSIS code to select this dependency
    out << "  SectionGetFlags ${" << depend->Name << "} $0\n";
    out << "  IntOp $0 $0 | ${SF_SELECTED}\n";
    out << "  SectionSetFlags ${" << depend->Name << "} $0\n";
    out << "  IntOp $" << depend->Name << "_selected 0 + ${SF_SELECTED}\n";
    // Recurse
    out << CreateSelectionDependenciesDescription(depend, visited).c_str();
  }

  return out.str();
}